

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

QByteArray * __thiscall
QStringBuilderBase<QStringBuilder<QString_&,_QLatin1String>,_QString>::toLatin1
          (QStringBuilderBase<QStringBuilder<QString_&,_QLatin1String>,_QString> *this)

{
  long lVar1;
  QStringBuilderCommon<QStringBuilder<QString_&,_QLatin1String>,_QString> *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilderCommon<QStringBuilder<QString_&,_QLatin1String>,_QString>::resolved(in_RDI);
  QString::toLatin1((QString *)in_RDI);
  QString::~QString((QString *)0x2f2ce9);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray toLatin1() const { return this->resolved().toLatin1(); }